

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDefaults.cpp
# Opt level: O0

int helics::getDefaultPort(int coreType)

{
  int coreType_local;
  int local_4;
  
  switch(coreType) {
  case 1:
    local_4 = 0x5b6c;
    break;
  default:
    local_4 = -1;
    break;
  case 6:
    local_4 = 0x5e60;
    break;
  case 7:
    local_4 = 0x5d5d;
    break;
  case 10:
    local_4 = 0x5b76;
    break;
  case 0xb:
    local_4 = 0x816d;
    break;
  case 0xc:
  case 0xe:
    local_4 = 0x50;
  }
  return local_4;
}

Assistant:

int getDefaultPort(int coreType)
{
    switch (coreType) {
        case HELICS_CORE_TYPE_TCP:
            return network::DEFAULT_TCP_PORT;
        case HELICS_CORE_TYPE_TCP_SS:
            return network::DEFAULT_TCPSS_PORT;
        case HELICS_CORE_TYPE_ZMQ:
            return network::DEFAULT_ZMQ_PORT;
        case HELICS_CORE_TYPE_ZMQ_SS:
            return network::DEFAULT_ZMQSS_PORT;
        case HELICS_CORE_TYPE_UDP:
            return network::DEFAULT_UDP_PORT;
        case HELICS_CORE_TYPE_HTTP:
        case HELICS_CORE_TYPE_WEBSOCKET:
            return 80;
        default:
            return (-1);
    }
}